

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

bool bssl::ssl_cert_extract_issuer(CBS *in,CBS *out_dn)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_50 [8];
  CBS cert;
  CBS toplevel;
  CBS buf;
  CBS *out_dn_local;
  CBS *in_local;
  
  toplevel.len = (size_t)in->data;
  iVar1 = CBS_get_asn1((CBS *)&toplevel.len,(CBS *)&cert.len,0x20000010);
  if ((((iVar1 != 0) && (sVar2 = CBS_len((CBS *)&toplevel.len), sVar2 == 0)) &&
      (iVar1 = CBS_get_asn1((CBS *)&cert.len,(CBS *)local_50,0x20000010), iVar1 != 0)) &&
     (((iVar1 = CBS_get_optional_asn1((CBS *)local_50,(CBS *)0x0,(int *)0x0,0xa0000000), iVar1 != 0
       && (iVar1 = CBS_get_asn1((CBS *)local_50,(CBS *)0x0,2), iVar1 != 0)) &&
      ((iVar1 = CBS_get_asn1((CBS *)local_50,(CBS *)0x0,0x20000010), iVar1 != 0 &&
       (iVar1 = CBS_get_asn1_element((CBS *)local_50,out_dn,0x20000010), iVar1 != 0)))))) {
    return true;
  }
  return false;
}

Assistant:

bool ssl_cert_extract_issuer(const CBS *in, CBS *out_dn) {
  CBS buf = *in;

  CBS toplevel;
  CBS cert;
  if (!CBS_get_asn1(&buf, &toplevel, CBS_ASN1_SEQUENCE) ||   //
      CBS_len(&buf) != 0 ||                                  //
      !CBS_get_asn1(&toplevel, &cert, CBS_ASN1_SEQUENCE) ||  //
      // version
      !CBS_get_optional_asn1(
          &cert, NULL, NULL,
          CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||  //
      // serialNumber
      !CBS_get_asn1(&cert, NULL, CBS_ASN1_INTEGER) ||  //
      // signature algorithm
      !CBS_get_asn1(&cert, NULL, CBS_ASN1_SEQUENCE) ||  //
      // issuer
      !CBS_get_asn1_element(&cert, out_dn, CBS_ASN1_SEQUENCE)) {
    return false;
  }
  return true;
}